

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O2

IOStream * __thiscall
Assimp::ZipArchiveIOSystem::Implement::OpenFile(Implement *this,string *filename)

{
  iterator iVar1;
  ZipFile *pZVar2;
  
  MapArchive(this);
  SimplifyFilename(filename);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
          ::find(&(this->m_ArchiveMap)._M_t,filename);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header)
  {
    pZVar2 = ZipFileInfo::Extract((ZipFileInfo *)(iVar1._M_node + 2),this->m_ZipFileHandle);
    return &pZVar2->super_IOStream;
  }
  return (IOStream *)0x0;
}

Assistant:

IOStream * ZipArchiveIOSystem::Implement::OpenFile(std::string& filename) {
        MapArchive();

        SimplifyFilename(filename);

        // Find in the map
        ZipFileInfoMap::const_iterator zip_it = m_ArchiveMap.find(filename);
        if (zip_it == m_ArchiveMap.cend())
            return nullptr;

        const ZipFileInfo &zip_file = (*zip_it).second;
        return zip_file.Extract(m_ZipFileHandle);
    }